

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O1

ostream * __thiscall
serialize::write<int,float>
          (serialize *this,ostream *ostream_,
          map<int,_float,_std::less<int>,_std::allocator<std::pair<const_int,_float>_>_> *container)

{
  size_t in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf;
  int __fd;
  float *pfVar2;
  long lVar4;
  _Rb_tree_node_base *this_00;
  serialize *this_01;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined8 local_40;
  pair<const_int,_float> p;
  uint32_t size;
  undefined8 *puVar3;
  
  p.second = *(float *)(ostream_ + 0x28);
  if (LE()::le == '\0') {
    write<int,float>(this,(int)ostream_,container,in_RCX);
  }
  if (LE()::le == '\0') {
    lVar6 = 3;
    do {
      pfVar2 = (float *)((long)&p.second + lVar6);
      this_00 = (_Rb_tree_node_base *)this;
      std::ostream::write((char *)this,(long)pfVar2);
      bVar7 = lVar6 != 0;
      lVar6 = lVar6 + -1;
      uVar1 = extraout_RDX_00;
    } while (bVar7);
  }
  else {
    pfVar2 = &p.second;
    this_00 = (_Rb_tree_node_base *)this;
    std::ostream::write((char *)this,(long)pfVar2);
    uVar1 = extraout_RDX;
  }
  auVar8._8_8_ = uVar1;
  auVar8._0_8_ = *(ostream **)(ostream_ + 0x18);
  if (*(ostream **)(ostream_ + 0x18) != ostream_ + 8) {
    do {
      p_Var5 = auVar8._0_8_;
      local_40 = *(undefined8 *)(p_Var5 + 1);
      if (LE()::le == '\0') {
        write<int,float>((serialize *)this_00,(int)pfVar2,auVar8._8_8_,in_RCX);
      }
      if (LE()::le == '\0') {
        lVar6 = 3;
        do {
          lVar4 = (long)&local_40 + lVar6;
          this_01 = this;
          std::ostream::write((char *)this,lVar4);
          __fd = (int)lVar4;
          bVar7 = lVar6 != 0;
          lVar6 = lVar6 + -1;
          __buf = extraout_RDX_02;
        } while (bVar7);
      }
      else {
        puVar3 = &local_40;
        this_01 = this;
        std::ostream::write((char *)this,(long)&local_40);
        __fd = (int)puVar3;
        __buf = extraout_RDX_01;
      }
      if (LE()::le == '\0') {
        write<int,float>(this_01,__fd,__buf,in_RCX);
      }
      if (LE()::le == '\0') {
        lVar6 = 7;
        do {
          pfVar2 = (float *)((long)&local_40 + lVar6);
          std::ostream::write((char *)this,(long)pfVar2);
          lVar6 = lVar6 + -1;
        } while (lVar6 != 3);
      }
      else {
        pfVar2 = (float *)((long)&local_40 + 4);
        std::ostream::write((char *)this,(long)pfVar2);
      }
      auVar8 = std::_Rb_tree_increment(p_Var5);
      this_00 = p_Var5;
    } while (auVar8._0_8_ != ostream_ + 8);
  }
  return (ostream *)this;
}

Assistant:

static inline ostream&  write(ostream& ostream_, map<K, V>& container)
{

	uint32_t size = container.size();
	write(ostream_, size);

	for (auto p : container)
	{
		write(ostream_, p.first);
		write(ostream_, p.second);


	}
	return ostream_;
}